

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ErrorList.cpp
# Opt level: O3

void __thiscall
amrex::ErrorList::add(ErrorList *this,string *name,int nextra,ErrorType typ,ErrorFunc *func)

{
  long *plVar1;
  ErrorRec *this_00;
  long lVar2;
  
  lVar2 = (*(long *)(this + 8) - *(long *)this) * 0x20000000;
  std::
  vector<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>,_std::allocator<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>_>_>
  ::resize((vector<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>,_std::allocator<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>_>_>
            *)this,lVar2 + 0x100000000 >> 0x20);
  this_00 = (ErrorRec *)operator_new(0x40);
  ErrorRec::ErrorRec(this_00,name,nextra,typ,func);
  lVar2 = lVar2 >> 0x1d;
  plVar1 = *(long **)(*(long *)this + lVar2);
  *(ErrorRec **)(*(long *)this + lVar2) = this_00;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
    return;
  }
  return;
}

Assistant:

void
ErrorList::add (const std::string&         name,
                int                        nextra,
                ErrorRec::ErrorType        typ,
                const ErrorRec::ErrorFunc& func)
{
    //
    // Keep list in order of definition, append().
    //
    int n = vec.size();
    vec.resize(n+1);
    vec[n] = std::make_unique<ErrorRec>(name, nextra, typ, func);
}